

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_f_Test::TestBody(PhPacker_Arg_f_Test *this)

{
  bool bVar1;
  char *pcVar2;
  float fVar3;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  string local_a0;
  uint local_7c;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  float expected;
  any local_48;
  float local_34;
  undefined1 local_30 [4];
  float result;
  string str;
  PhPacker_Arg_f_Test *this_local;
  
  str.field_2._8_8_ = this;
  PhPacker::pack<float,_0>((string *)local_30,'f',1.234);
  PhPacker::unpack((PhPacker *)&local_48,'f',(string *)local_30);
  fVar3 = std::any_cast<float>(&local_48);
  std::any::~any(&local_48);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x3f9df3b6;
  local_34 = fVar3;
  testing::internal::EqHelper::Compare<float,_float,_nullptr>
            ((EqHelper *)local_68,"result","expected",&local_34,(float *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x149,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  local_7c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  if (local_7c == 0) {
    PhPacker::pack<float,_0>(&local_a0,'f',65232.12);
    std::__cxx11::string::operator=((string *)local_30,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    PhPacker::unpack((PhPacker *)&gtest_ar_1.message_,'f',(string *)local_30);
    local_34 = std::any_cast<float>((any *)&gtest_ar_1.message_);
    std::any::~any((any *)&gtest_ar_1.message_);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0x477ed01f;
    testing::internal::EqHelper::Compare<float,_float,_nullptr>
              ((EqHelper *)local_c0,"result","expected",&local_34,(float *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x14e,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    local_7c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    if (local_7c == 0) {
      local_7c = 0;
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(PhPacker, Arg_f)
{
   std::string str = PhPacker::pack<float>('f', 1.234f);
   float result = std::any_cast<float>(PhPacker::unpack('f', str));
   float expected = 1.234f;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<float>('f', 65232.123f);
   result = std::any_cast<float>(PhPacker::unpack('f', str));
   expected = 65232.123f;
   GTEST_ASSERT_EQ(result, expected);
}